

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clagge.c
# Opt level: O3

int clagge_slu(int *m,int *n,int *kl,int *ku,float *d,singlecomplex *a,int *lda,int *iseed,
              singlecomplex *work,int *info)

{
  double dVar1;
  uint *puVar2;
  singlecomplex *psVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  float *pfVar12;
  uint *puVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  int *piVar17;
  float fVar18;
  float fVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar20;
  uint local_ac;
  singlecomplex local_a8;
  uint local_a0;
  uint local_9c;
  int *local_98;
  uint *local_90;
  int local_84;
  singlecomplex *local_80;
  uint *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  uint *local_50;
  undefined1 local_48 [16];
  
  iVar4 = *lda;
  local_70 = (ulong)iVar4;
  *info = 0;
  uVar16 = *m;
  local_98 = m;
  if ((int)uVar16 < 0) {
    local_9c = 1;
    iVar4 = -1;
  }
  else {
    uVar5 = *n;
    if ((long)(int)uVar5 < 0) {
      local_9c = 2;
      iVar4 = -2;
    }
    else if ((uint)*kl < uVar16) {
      if ((uint)*ku < uVar5) {
        if ((int)uVar16 <= *lda) {
          local_48._8_8_ = local_48._0_8_;
          local_48._0_8_ = d;
          local_80 = a + ~local_70;
          local_84 = iVar4 + 1;
          lVar14 = 0;
          lVar10 = 0;
          local_ac = uVar16;
          local_9c = uVar5;
          local_90 = (uint *)n;
          local_78 = (uint *)kl;
          local_50 = (uint *)ku;
          do {
            memset(local_80 + ((int)local_70 * (int)lVar10 + local_84),0,(ulong)uVar16 * 8);
            uVar6 = 0;
            do {
              uVar6 = uVar6 + 1;
            } while (uVar16 != uVar6);
            lVar10 = lVar10 + 1;
            lVar14 = lVar14 + (ulong)(uint)-iVar4;
          } while (lVar10 != (int)uVar5);
          if ((int)uVar5 <= (int)uVar16) {
            uVar16 = uVar5;
          }
          if ((int)uVar16 < 1) {
            uVar6 = uVar6 - lVar14;
          }
          else {
            local_ac = 0;
            uVar6 = 0;
            do {
              local_ac = local_ac + (int)local_70 + 1;
              local_80[(int)local_ac].r = *(float *)(local_48._0_8_ + uVar6 * 4);
              local_80[(int)local_ac].i = 0.0;
              uVar6 = uVar6 + 1;
            } while (uVar16 != uVar6);
          }
          local_a0 = (uint)uVar6;
          local_68._0_8_ = work + 1;
          local_84 = (int)local_70 + 1;
          uVar6 = local_70;
          do {
            iVar4 = *local_98 - uVar16;
            clagge_slu::i = uVar16;
            if (iVar4 != 0 && (int)uVar16 <= *local_98) {
              local_9c = iVar4 + 1;
              clarnv_slu(&c__3,iseed,(int *)&local_9c,work);
              piVar17 = local_98;
              local_9c = (*local_98 - clagge_slu::i) + 1;
              clagge_slu::wn = scnrm2_((integer *)&local_9c,work,&c__1);
              local_48._8_4_ = extraout_XMM0_Dc;
              local_48._0_8_ = (double)clagge_slu::wn;
              local_48._12_4_ = extraout_XMM0_Dd;
              dVar1 = c_abs(work);
              fVar18 = (float)(((double)local_48._0_8_ / dVar1) * (double)(*work).r);
              fVar19 = (float)(((double)local_48._0_8_ / dVar1) * (double)(*work).i);
              local_a8.i = fVar19;
              local_a8.r = fVar18;
              clagge_slu::wa.i = fVar19;
              clagge_slu::wa.r = fVar18;
              if ((clagge_slu::wn != 0.0) || (fVar20 = 0.0, NAN(clagge_slu::wn))) {
                clagge_slu::wb.r = (*work).r + fVar18;
                clagge_slu::wb.i = (*work).i + fVar19;
                local_9c = *piVar17 - clagge_slu::i;
                local_a8 = clagge_slu::wb;
                c_div(&local_a8,&c_b2,&clagge_slu::wb);
                cscal_((integer *)&local_9c,&local_a8,(singlecomplex *)local_68._0_8_,&c__1);
                work->r = 1.0;
                work->i = 0.0;
                c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
                fVar20 = local_a8.r;
              }
              psVar3 = local_80;
              iVar4 = local_84;
              local_9c = (*piVar17 - clagge_slu::i) + 1;
              local_ac = (*local_90 - clagge_slu::i) + 1;
              clagge_slu_tau_0 = fVar20;
              cgemv_("Conjugate transpose",(integer *)&local_9c,(integer *)&local_ac,&c_b2,
                     local_80 + clagge_slu::i * local_84,lda,work,&c__1,&c_b1,work + *piVar17,&c__1)
              ;
              local_9c = (*piVar17 - clagge_slu::i) + 1;
              local_ac = (*local_90 - clagge_slu::i) + 1;
              local_a8.i = -0.0;
              local_a8.r = -clagge_slu_tau_0;
              cgerc_((integer *)&local_9c,(integer *)&local_ac,&local_a8,work,&c__1,work + *piVar17,
                     &c__1,psVar3 + clagge_slu::i * iVar4,lda);
              uVar6 = local_70;
            }
            iVar4 = *local_90 - clagge_slu::i;
            if (iVar4 != 0 && clagge_slu::i <= (int)*local_90) {
              local_9c = iVar4 + 1;
              clarnv_slu(&c__3,iseed,(int *)&local_9c,work);
              local_9c = (*local_90 - clagge_slu::i) + 1;
              clagge_slu::wn = scnrm2_((integer *)&local_9c,work,&c__1);
              local_48._8_4_ = extraout_XMM0_Dc_00;
              local_48._0_8_ = (double)clagge_slu::wn;
              local_48._12_4_ = extraout_XMM0_Dd_00;
              dVar1 = c_abs(work);
              fVar18 = (float)(((double)local_48._0_8_ / dVar1) * (double)(*work).r);
              fVar19 = (float)(((double)local_48._0_8_ / dVar1) * (double)(*work).i);
              local_a8.i = fVar19;
              local_a8.r = fVar18;
              clagge_slu::wa.i = fVar19;
              clagge_slu::wa.r = fVar18;
              if ((clagge_slu::wn != 0.0) || (fVar20 = 0.0, NAN(clagge_slu::wn))) {
                clagge_slu::wb.r = (*work).r + fVar18;
                clagge_slu::wb.i = (*work).i + fVar19;
                local_9c = *local_90 - clagge_slu::i;
                local_a8 = clagge_slu::wb;
                c_div(&local_a8,&c_b2,&clagge_slu::wb);
                cscal_((integer *)&local_9c,&local_a8,(singlecomplex *)local_68._0_8_,&c__1);
                work->r = 1.0;
                work->i = 0.0;
                c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
                fVar20 = local_a8.r;
              }
              psVar3 = local_80;
              iVar4 = local_84;
              piVar17 = local_98;
              local_9c = (*local_98 - clagge_slu::i) + 1;
              local_ac = (*local_90 - clagge_slu::i) + 1;
              clagge_slu_tau_0 = fVar20;
              cgemv_("No transpose",(integer *)&local_9c,(integer *)&local_ac,&c_b2,
                     local_80 + clagge_slu::i * local_84,lda,work,&c__1,&c_b1,work + (int)*local_90,
                     &c__1);
              local_9c = (*piVar17 - clagge_slu::i) + 1;
              local_ac = (*local_90 - clagge_slu::i) + 1;
              local_a8.i = -0.0;
              local_a8.r = -clagge_slu_tau_0;
              cgerc_((integer *)&local_9c,(integer *)&local_ac,&local_a8,work + (int)*local_90,&c__1
                     ,work,&c__1,psVar3 + clagge_slu::i * iVar4,lda);
              uVar6 = local_70;
            }
            uVar16 = clagge_slu::i - 1;
          } while (1 < clagge_slu::i);
          iVar4 = *local_98;
          uVar16 = *local_78;
          uVar5 = *local_90;
          uVar7 = *local_50;
          local_a0 = ~uVar7 + uVar5;
          local_9c = local_a0;
          if ((int)local_a0 < (int)(~uVar16 + iVar4)) {
            local_9c = ~uVar16 + iVar4;
          }
          clagge_slu::i = 1;
          if ((int)local_9c < 1) {
            clagge_slu::i = 1;
            return 0;
          }
          local_84 = (int)uVar6 + 1;
          local_48._0_8_ = uVar6 * 8;
          puVar13 = local_50;
          do {
            psVar3 = local_80;
            iVar11 = (int)uVar6;
            iVar15 = clagge_slu::i;
            if ((int)uVar7 < (int)uVar16) {
              iVar8 = ~uVar7 + uVar5;
              if (iVar4 <= (int)(~uVar7 + uVar5)) {
                iVar8 = iVar4;
              }
              if (clagge_slu::i <= iVar8) {
                local_ac = (uVar5 - (uVar7 + clagge_slu::i)) + 1;
                clagge_slu::wn =
                     scnrm2_((integer *)&local_ac,
                             local_80 + (int)((uVar7 + clagge_slu::i) * iVar11 + clagge_slu::i),lda)
                ;
                local_68._8_4_ = extraout_XMM0_Dc_01;
                local_68._0_8_ = (double)clagge_slu::wn;
                local_68._12_4_ = extraout_XMM0_Dd_01;
                dVar1 = c_abs(psVar3 + (int)((*puVar13 + clagge_slu::i) * iVar11 + clagge_slu::i));
                iVar4 = *puVar13 + clagge_slu::i;
                lVar10 = (long)(iVar4 * iVar11 + clagge_slu::i);
                clagge_slu::wa.r =
                     (float)(((double)local_68._0_8_ / dVar1) * (double)psVar3[lVar10].r);
                clagge_slu::wa.i =
                     (float)(((double)local_68._0_8_ / dVar1) * (double)psVar3[lVar10].i);
                fVar18 = 0.0;
                if ((clagge_slu::wn != 0.0) || (local_a8 = clagge_slu::wa, NAN(clagge_slu::wn))) {
                  fVar18 = psVar3[lVar10].r + clagge_slu::wa.r;
                  fVar19 = psVar3[lVar10].i + clagge_slu::wa.i;
                  local_a8.i = fVar19;
                  local_a8.r = fVar18;
                  clagge_slu::wb.i = fVar19;
                  clagge_slu::wb.r = fVar18;
                  local_ac = *local_90 - iVar4;
                  c_div(&local_a8,&c_b2,&clagge_slu::wb);
                  cscal_((integer *)&local_ac,&local_a8,
                         psVar3 + (int)((*puVar13 + clagge_slu::i + 1) * iVar11 + clagge_slu::i),lda
                        );
                  local_ac = (*puVar13 + clagge_slu::i) * iVar11 + clagge_slu::i;
                  psVar3[(int)local_ac].r = 1.0;
                  psVar3[(int)local_ac].i = 0.0;
                  c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
                  iVar4 = *puVar13 + clagge_slu::i;
                  lVar10 = (long)(iVar4 * iVar11 + clagge_slu::i);
                  fVar18 = local_a8.r;
                }
                puVar2 = local_90;
                piVar17 = local_98;
                local_ac = (*local_90 - iVar4) + 1;
                clagge_slu_tau_0 = fVar18;
                clacgv_slu((int *)&local_ac,psVar3 + lVar10,lda);
                local_ac = *piVar17 - clagge_slu::i;
                local_a0 = (*puVar2 - (*puVar13 + clagge_slu::i)) + 1;
                iVar4 = (*puVar13 + clagge_slu::i) * iVar11;
                cgemv_("No transpose",(integer *)&local_ac,(integer *)&local_a0,&c_b2,
                       psVar3 + (clagge_slu::i + iVar4 + 1),lda,psVar3 + (iVar4 + clagge_slu::i),lda
                       ,&c_b1,work,&c__1);
                local_ac = *local_98 - clagge_slu::i;
                local_a0 = (*puVar2 - (*puVar13 + clagge_slu::i)) + 1;
                local_a8.i = -0.0;
                local_a8.r = -clagge_slu_tau_0;
                iVar4 = (*puVar13 + clagge_slu::i) * iVar11;
                cgerc_((integer *)&local_ac,(integer *)&local_a0,&local_a8,work,&c__1,
                       psVar3 + (iVar4 + clagge_slu::i),lda,psVar3 + (iVar4 + clagge_slu::i + 1),lda
                      );
                iVar15 = clagge_slu::i;
                local_a8 = (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                psVar3[(int)((*puVar13 + clagge_slu::i) * iVar11 + clagge_slu::i)] =
                     (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                iVar4 = *local_98;
                uVar16 = *local_78;
                uVar5 = *puVar2;
              }
              psVar3 = local_80;
              uVar7 = ~uVar16 + iVar4;
              if ((int)uVar5 <= (int)(~uVar16 + iVar4)) {
                uVar7 = uVar5;
              }
              piVar17 = local_98;
              if (iVar15 <= (int)uVar7) {
                local_ac = (iVar4 - (uVar16 + iVar15)) + 1;
                clagge_slu::wn =
                     scnrm2_((integer *)&local_ac,
                             local_80 + (int)(iVar15 * iVar11 + uVar16 + iVar15),&c__1);
                puVar13 = local_78;
                local_68._8_4_ = extraout_XMM0_Dc_03;
                local_68._0_8_ = (double)clagge_slu::wn;
                local_68._12_4_ = extraout_XMM0_Dd_03;
                dVar1 = c_abs(psVar3 + (int)(clagge_slu::i * iVar11 + *local_78 + clagge_slu::i));
                piVar17 = local_98;
                iVar4 = *puVar13 + clagge_slu::i;
                lVar10 = (long)(clagge_slu::i * iVar11 + iVar4);
                clagge_slu::wa.r =
                     (float)(((double)local_68._0_8_ / dVar1) * (double)psVar3[lVar10].r);
                clagge_slu::wa.i =
                     (float)(((double)local_68._0_8_ / dVar1) * (double)psVar3[lVar10].i);
                fVar18 = 0.0;
                if ((clagge_slu::wn != 0.0) || (local_a8 = clagge_slu::wa, NAN(clagge_slu::wn))) {
                  fVar18 = psVar3[lVar10].r + clagge_slu::wa.r;
                  fVar19 = psVar3[lVar10].i + clagge_slu::wa.i;
                  local_a8.i = fVar19;
                  local_a8.r = fVar18;
                  clagge_slu::wb.i = fVar19;
                  clagge_slu::wb.r = fVar18;
                  local_ac = *local_98 - iVar4;
                  c_div(&local_a8,&c_b2,&clagge_slu::wb);
                  cscal_((integer *)&local_ac,&local_a8,
                         psVar3 + (int)(clagge_slu::i + *puVar13 + clagge_slu::i * iVar11 + 1),&c__1
                        );
                  local_ac = clagge_slu::i * iVar11 + *puVar13 + clagge_slu::i;
                  psVar3[(int)local_ac].r = 1.0;
                  psVar3[(int)local_ac].i = 0.0;
                  c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
                  iVar4 = *puVar13 + clagge_slu::i;
                  lVar10 = (long)(clagge_slu::i * iVar11 + iVar4);
                  fVar18 = local_a8.r;
                }
                puVar2 = local_90;
                local_ac = (*piVar17 - iVar4) + 1;
                local_a0 = *local_90 - clagge_slu::i;
                clagge_slu_tau_0 = fVar18;
                cgemv_("Conjugate transpose",(integer *)&local_ac,(integer *)&local_a0,&c_b2,
                       psVar3 + ((clagge_slu::i + 1) * iVar11 + iVar4),lda,psVar3 + lVar10,&c__1,
                       &c_b1,work,&c__1);
                iVar4 = *puVar13 + clagge_slu::i;
                local_ac = (*piVar17 - iVar4) + 1;
                local_a0 = *puVar2 - clagge_slu::i;
                local_a8.i = -0.0;
                local_a8.r = -clagge_slu_tau_0;
                cgerc_((integer *)&local_ac,(integer *)&local_a0,&local_a8,
                       psVar3 + (clagge_slu::i * iVar11 + iVar4),&c__1,work,&c__1,
                       psVar3 + ((clagge_slu::i + 1) * iVar11 + iVar4),lda);
                iVar15 = clagge_slu::i;
                uVar16 = *puVar13;
                local_a8 = (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                psVar3[(int)(clagge_slu::i * iVar11 + clagge_slu::i + uVar16)] =
                     (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                puVar13 = local_50;
              }
            }
            else {
              uVar9 = ~uVar16 + iVar4;
              if ((int)uVar5 <= (int)(~uVar16 + iVar4)) {
                uVar9 = uVar5;
              }
              if (clagge_slu::i <= (int)uVar9) {
                local_ac = (iVar4 - (uVar16 + clagge_slu::i)) + 1;
                clagge_slu::wn =
                     scnrm2_((integer *)&local_ac,
                             local_80 + (int)(clagge_slu::i * iVar11 + uVar16 + clagge_slu::i),&c__1
                            );
                puVar13 = local_78;
                local_68._8_4_ = extraout_XMM0_Dc_02;
                local_68._0_8_ = (double)clagge_slu::wn;
                local_68._12_4_ = extraout_XMM0_Dd_02;
                dVar1 = c_abs(psVar3 + (int)(clagge_slu::i * iVar11 + *local_78 + clagge_slu::i));
                piVar17 = local_98;
                iVar4 = *puVar13 + clagge_slu::i;
                lVar10 = (long)(clagge_slu::i * iVar11 + iVar4);
                clagge_slu::wa.r =
                     (float)(((double)local_68._0_8_ / dVar1) * (double)psVar3[lVar10].r);
                clagge_slu::wa.i =
                     (float)(((double)local_68._0_8_ / dVar1) * (double)psVar3[lVar10].i);
                fVar18 = 0.0;
                if ((clagge_slu::wn != 0.0) || (local_a8 = clagge_slu::wa, NAN(clagge_slu::wn))) {
                  fVar18 = psVar3[lVar10].r + clagge_slu::wa.r;
                  fVar19 = psVar3[lVar10].i + clagge_slu::wa.i;
                  local_a8.i = fVar19;
                  local_a8.r = fVar18;
                  clagge_slu::wb.i = fVar19;
                  clagge_slu::wb.r = fVar18;
                  local_ac = *local_98 - iVar4;
                  c_div(&local_a8,&c_b2,&clagge_slu::wb);
                  cscal_((integer *)&local_ac,&local_a8,
                         psVar3 + (int)(clagge_slu::i + *puVar13 + clagge_slu::i * iVar11 + 1),&c__1
                        );
                  local_ac = clagge_slu::i * iVar11 + *puVar13 + clagge_slu::i;
                  psVar3[(int)local_ac].r = 1.0;
                  psVar3[(int)local_ac].i = 0.0;
                  c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
                  iVar4 = *puVar13 + clagge_slu::i;
                  lVar10 = (long)(clagge_slu::i * iVar11 + iVar4);
                  fVar18 = local_a8.r;
                }
                puVar13 = local_90;
                local_ac = (*piVar17 - iVar4) + 1;
                local_a0 = *local_90 - clagge_slu::i;
                clagge_slu_tau_0 = fVar18;
                cgemv_("Conjugate transpose",(integer *)&local_ac,(integer *)&local_a0,&c_b2,
                       psVar3 + ((clagge_slu::i + 1) * iVar11 + iVar4),lda,psVar3 + lVar10,&c__1,
                       &c_b1,work,&c__1);
                puVar2 = local_78;
                iVar4 = *local_78 + clagge_slu::i;
                local_ac = (*piVar17 - iVar4) + 1;
                local_a0 = *puVar13 - clagge_slu::i;
                local_a8.i = -0.0;
                local_a8.r = -clagge_slu_tau_0;
                cgerc_((integer *)&local_ac,(integer *)&local_a0,&local_a8,
                       psVar3 + (clagge_slu::i * iVar11 + iVar4),&c__1,work,&c__1,
                       psVar3 + ((clagge_slu::i + 1) * iVar11 + iVar4),lda);
                iVar15 = clagge_slu::i;
                uVar16 = *puVar2;
                local_a8 = (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                psVar3[(int)(clagge_slu::i * iVar11 + clagge_slu::i + uVar16)] =
                     (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                uVar5 = *puVar13;
                uVar7 = *local_50;
                iVar4 = *local_98;
                puVar13 = local_50;
              }
              psVar3 = local_80;
              iVar8 = ~uVar7 + uVar5;
              if (iVar4 <= (int)(~uVar7 + uVar5)) {
                iVar8 = iVar4;
              }
              piVar17 = local_98;
              if (iVar15 <= iVar8) {
                local_ac = (uVar5 - (uVar7 + iVar15)) + 1;
                clagge_slu::wn =
                     scnrm2_((integer *)&local_ac,
                             local_80 + (int)((uVar7 + iVar15) * iVar11 + iVar15),lda);
                local_68._8_4_ = extraout_XMM0_Dc_04;
                local_68._0_8_ = (double)clagge_slu::wn;
                local_68._12_4_ = extraout_XMM0_Dd_04;
                dVar1 = c_abs(psVar3 + (int)((*puVar13 + clagge_slu::i) * iVar11 + clagge_slu::i));
                iVar4 = *puVar13 + clagge_slu::i;
                lVar10 = (long)(iVar4 * iVar11 + clagge_slu::i);
                clagge_slu::wa.r =
                     (float)(((double)local_68._0_8_ / dVar1) * (double)psVar3[lVar10].r);
                clagge_slu::wa.i =
                     (float)(((double)local_68._0_8_ / dVar1) * (double)psVar3[lVar10].i);
                if ((clagge_slu::wn != 0.0) ||
                   (fVar18 = 0.0, local_a8 = clagge_slu::wa, NAN(clagge_slu::wn))) {
                  fVar18 = psVar3[lVar10].r + clagge_slu::wa.r;
                  fVar19 = psVar3[lVar10].i + clagge_slu::wa.i;
                  local_a8.i = fVar19;
                  local_a8.r = fVar18;
                  clagge_slu::wb.i = fVar19;
                  clagge_slu::wb.r = fVar18;
                  local_ac = *local_90 - iVar4;
                  c_div(&local_a8,&c_b2,&clagge_slu::wb);
                  cscal_((integer *)&local_ac,&local_a8,
                         psVar3 + (int)((*puVar13 + clagge_slu::i + 1) * iVar11 + clagge_slu::i),lda
                        );
                  local_ac = (*puVar13 + clagge_slu::i) * iVar11 + clagge_slu::i;
                  psVar3[(int)local_ac].r = 1.0;
                  psVar3[(int)local_ac].i = 0.0;
                  c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
                  iVar4 = *puVar13 + clagge_slu::i;
                  lVar10 = (long)(iVar4 * iVar11 + clagge_slu::i);
                  fVar18 = local_a8.r;
                }
                puVar2 = local_90;
                local_ac = (*local_90 - iVar4) + 1;
                clagge_slu_tau_0 = fVar18;
                clacgv_slu((int *)&local_ac,psVar3 + lVar10,lda);
                local_ac = *local_98 - clagge_slu::i;
                local_a0 = (*puVar2 - (*puVar13 + clagge_slu::i)) + 1;
                iVar4 = (*puVar13 + clagge_slu::i) * iVar11;
                cgemv_("No transpose",(integer *)&local_ac,(integer *)&local_a0,&c_b2,
                       psVar3 + (clagge_slu::i + iVar4 + 1),lda,psVar3 + (iVar4 + clagge_slu::i),lda
                       ,&c_b1,work,&c__1);
                piVar17 = local_98;
                local_ac = *local_98 - clagge_slu::i;
                local_a0 = (*local_90 - (*puVar13 + clagge_slu::i)) + 1;
                local_a8.i = -0.0;
                local_a8.r = -clagge_slu_tau_0;
                iVar4 = (*puVar13 + clagge_slu::i) * iVar11;
                cgerc_((integer *)&local_ac,(integer *)&local_a0,&local_a8,work,&c__1,
                       psVar3 + (iVar4 + clagge_slu::i),lda,psVar3 + (iVar4 + clagge_slu::i + 1),lda
                      );
                iVar15 = clagge_slu::i;
                local_a8 = (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                psVar3[(int)((*puVar13 + clagge_slu::i) * iVar11 + clagge_slu::i)] =
                     (singlecomplex)((ulong)clagge_slu::wa ^ 0x8000000080000000);
                uVar16 = *local_78;
              }
            }
            iVar4 = *piVar17;
            lVar10 = (long)iVar15;
            if ((int)(uVar16 + iVar15) < iVar4) {
              iVar11 = local_84 * iVar15;
              memset(local_80 + (int)(uVar16 + iVar11 + 1),0,
                     (ulong)((~uVar16 + iVar4) - iVar15) * 8 + 8);
              local_a0 = iVar11 + uVar16;
              lVar14 = (int)uVar16 + lVar10;
              do {
                local_a0 = local_a0 + 1;
                lVar14 = lVar14 + 1;
                uVar6 = local_70;
                puVar13 = local_50;
              } while (lVar14 < iVar4);
            }
            uVar5 = *local_90;
            uVar7 = *puVar13;
            if ((int)(uVar7 + iVar15) < (int)uVar5) {
              lVar14 = (int)uVar7 + lVar10;
              local_a0 = (uVar7 + iVar15) * (int)uVar6 + iVar15;
              pfVar12 = (float *)((long)&local_80[lVar10].r +
                                 (lVar10 + (int)uVar7 + 1) * local_48._0_8_);
              do {
                *(undefined8 *)pfVar12 = 0;
                lVar14 = lVar14 + 1;
                local_a0 = local_a0 + (int)uVar6;
                pfVar12 = (float *)((long)pfVar12 + local_48._0_8_);
              } while (lVar14 < (int)uVar5);
            }
            clagge_slu::i = iVar15 + 1;
            local_ac = uVar5;
          } while (iVar15 < (int)local_9c);
          return 0;
        }
        local_9c = 7;
        iVar4 = -7;
      }
      else {
        local_9c = 4;
        iVar4 = -4;
      }
    }
    else {
      local_9c = 3;
      iVar4 = -3;
    }
  }
  *info = iVar4;
  input_error("CLAGGE",(int *)&local_9c);
  return 0;
}

Assistant:

int clagge_slu(int *m, int *n, int *kl, int *ku,
	 float *d, singlecomplex *a, int *lda, int *iseed, singlecomplex *work,
	int *info)
{
    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3;
    double d__1;
    singlecomplex q__1;

    /* Local variables */
    static int i, j;
    extern /* Subroutine */ int cgerc_(int *, int *, singlecomplex *,
	    singlecomplex *, int *, singlecomplex *, int *, singlecomplex *, int *),
	cscal_(int *, singlecomplex *, singlecomplex *, int *); 
    extern float scnrm2_(int *, singlecomplex *, int *);
    static singlecomplex wa, wb;
    extern /* Subroutine */ int clacgv_slu(int *, singlecomplex *, int *);
    static float wn;
    extern /* Subroutine */ int clarnv_slu(int *, int *, int *, singlecomplex *);
    extern int input_error(char *, int *);
    static singlecomplex tau;


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    CLAGGE generates a complex general m by n matrix A, by pre- and post- 
  
    multiplying a real diagonal matrix D with random unitary matrices:   
    A = U*D*V. The lower and upper bandwidths may then be reduced to   
    kl and ku by additional unitary transformations.   

    Arguments   
    =========   

    M       (input) INTEGER   
            The number of rows of the matrix A.  M >= 0.   

    N       (input) INTEGER   
            The number of columns of the matrix A.  N >= 0.   

    KL      (input) INTEGER   
            The number of nonzero subdiagonals within the band of A.   
            0 <= KL <= M-1.   

    KU      (input) INTEGER   
            The number of nonzero superdiagonals within the band of A.   
            0 <= KU <= N-1.   

    D       (input) REAL array, dimension (min(M,N))   
            The diagonal elements of the diagonal matrix D.   

    A       (output) COMPLEX array, dimension (LDA,N)   
            The generated m by n matrix A.   

    LDA     (input) INTEGER   
            The leading dimension of the array A.  LDA >= M.   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    WORK    (workspace) COMPLEX array, dimension (M+N)   

    INFO    (output) INTEGER   
            = 0: successful exit   
            < 0: if INFO = -i, the i-th argument had an illegal value   

    ===================================================================== 
  


       Test the input arguments   

       Parameter adjustments */
    --d;
    a_dim1 = *lda;
    a_offset = a_dim1 + 1;
    a -= a_offset;
    --iseed;
    --work;

    /* Function Body */
    *info = 0;
    if (*m < 0) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*kl < 0 || *kl > *m - 1) {
	*info = -3;
    } else if (*ku < 0 || *ku > *n - 1) {
	*info = -4;
    } else if (*lda < SUPERLU_MAX(1,*m)) {
	*info = -7;
    }
    if (*info < 0) {
	i__1 = -(*info);
	input_error("CLAGGE", &i__1);
	return 0;
    }

/*     initialize A to diagonal matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *m;
	for (i = 1; i <= i__2; ++i) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0.f, a[i__3].i = 0.f;
/* L10: */
	}
/* L20: */
    }
    i__1 = SUPERLU_MIN(*m,*n);
    for (i = 1; i <= i__1; ++i) {
	i__2 = i + i * a_dim1;
	i__3 = i;
	a[i__2].r = d[i__3], a[i__2].i = 0.f;
/* L30: */
    }

/*     pre- and post-multiply A by random unitary matrices */

    for (i = SUPERLU_MIN(*m,*n); i >= 1; --i) {
	if (i < *m) {

/*           generate random reflection */

	    i__1 = *m - i + 1;
	    clarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	    i__1 = *m - i + 1;
	    wn = scnrm2_(&i__1, &work[1], &c__1);
	    d__1 = wn / c_abs(&work[1]);
	    q__1.r = d__1 * work[1].r, q__1.i = d__1 * work[1].i;
	    wa.r = q__1.r, wa.i = q__1.i;
	    if (wn == 0.f) {
		tau.r = 0.f, tau.i = 0.f;
	    } else {
		q__1.r = work[1].r + wa.r, q__1.i = work[1].i + wa.i;
		wb.r = q__1.r, wb.i = q__1.i;
		i__1 = *m - i;
		c_div(&q__1, &c_b2, &wb);
		cscal_(&i__1, &q__1, &work[2], &c__1);
		work[1].r = 1.f, work[1].i = 0.f;
		c_div(&q__1, &wb, &wa);
		d__1 = q__1.r;
		tau.r = d__1, tau.i = 0.f;
	    }

/*           multiply A(i:m,i:n) by random reflection from the lef
t */

	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    cgemv_("Conjugate transpose", &i__1, &i__2, &c_b2, &a[i + i * 
		    a_dim1], lda, &work[1], &c__1, &c_b1, &work[*m + 1], &
		    c__1);
	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
	    cgerc_(&i__1, &i__2, &q__1, &work[1], &c__1, &work[*m + 1], &c__1,
		     &a[i + i * a_dim1], lda);
	}
	if (i < *n) {

/*           generate random reflection */

	    i__1 = *n - i + 1;
	    clarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	    i__1 = *n - i + 1;
	    wn = scnrm2_(&i__1, &work[1], &c__1);
	    d__1 = wn / c_abs(&work[1]);
	    q__1.r = d__1 * work[1].r, q__1.i = d__1 * work[1].i;
	    wa.r = q__1.r, wa.i = q__1.i;
	    if (wn == 0.f) {
		tau.r = 0.f, tau.i = 0.f;
	    } else {
		q__1.r = work[1].r + wa.r, q__1.i = work[1].i + wa.i;
		wb.r = q__1.r, wb.i = q__1.i;
		i__1 = *n - i;
		c_div(&q__1, &c_b2, &wb);
		cscal_(&i__1, &q__1, &work[2], &c__1);
		work[1].r = 1.f, work[1].i = 0.f;
		c_div(&q__1, &wb, &wa);
		d__1 = q__1.r;
		tau.r = d__1, tau.i = 0.f;
	    }

/*           multiply A(i:m,i:n) by random reflection from the rig
ht */

	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    cgemv_("No transpose", &i__1, &i__2, &c_b2, &a[i + i * a_dim1], 
		    lda, &work[1], &c__1, &c_b1, &work[*n + 1], &c__1);
	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
	    cgerc_(&i__1, &i__2, &q__1, &work[*n + 1], &c__1, &work[1], &c__1,
		     &a[i + i * a_dim1], lda);
	}
/* L40: */
    }

/*     Reduce number of subdiagonals to KL and number of superdiagonals   
       to KU   

   Computing MAX */
    i__2 = *m - 1 - *kl, i__3 = *n - 1 - *ku;
    i__1 = SUPERLU_MAX(i__2,i__3);
    for (i = 1; i <= i__1; ++i) {
	if (*kl <= *ku) {

/*           annihilate subdiagonal elements first (necessary if K
L = 0)   

   Computing MIN */
	    i__2 = *m - 1 - *kl;
	    if (i <= SUPERLU_MIN(i__2,*n)) {

/*              generate reflection to annihilate A(kl+i+1:m,i
) */

		i__2 = *m - *kl - i + 1;
		wn = scnrm2_(&i__2, &a[*kl + i + i * a_dim1], &c__1);
		d__1 = wn / c_abs(&a[*kl + i + i * a_dim1]);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = *kl + i + i * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *m - *kl - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[*kl + i + 1 + i * a_dim1], &c__1);
		    i__2 = *kl + i + i * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(kl+i:m,i+1:n) from the l
eft */

		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		cgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*kl + i 
			+ (i + 1) * a_dim1], lda, &a[*kl + i + i * a_dim1], &
			c__1, &c_b1, &work[1], &c__1);
		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &a[*kl + i + i * a_dim1], &c__1, &
			work[1], &c__1, &a[*kl + i + (i + 1) * a_dim1], lda);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }

/* Computing MIN */
	    i__2 = *n - 1 - *ku;
	    if (i <= SUPERLU_MIN(i__2,*m)) {

/*              generate reflection to annihilate A(i,ku+i+1:n
) */

		i__2 = *n - *ku - i + 1;
		wn = scnrm2_(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		d__1 = wn / c_abs(&a[i + (*ku + i) * a_dim1]);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = i + (*ku + i) * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *n - *ku - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[i + (*ku + i + 1) * a_dim1], lda);
		    i__2 = i + (*ku + i) * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(i+1:m,ku+i:n) from the r
ight */

		i__2 = *n - *ku - i + 1;
		clacgv_slu(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		cgemv_("No transpose", &i__2, &i__3, &c_b2, &a[i + 1 + (*ku + 
			i) * a_dim1], lda, &a[i + (*ku + i) * a_dim1], lda, &
			c_b1, &work[1], &c__1);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &work[1], &c__1, &a[i + (*ku + i) 
			* a_dim1], lda, &a[i + 1 + (*ku + i) * a_dim1], lda);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }
	} else {

/*           annihilate superdiagonal elements first (necessary if
   
             KU = 0)   

   Computing MIN */
	    i__2 = *n - 1 - *ku;
	    if (i <= SUPERLU_MIN(i__2,*m)) {

/*              generate reflection to annihilate A(i,ku+i+1:n
) */

		i__2 = *n - *ku - i + 1;
		wn = scnrm2_(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		d__1 = wn / c_abs(&a[i + (*ku + i) * a_dim1]);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = i + (*ku + i) * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *n - *ku - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[i + (*ku + i + 1) * a_dim1], lda);
		    i__2 = i + (*ku + i) * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(i+1:m,ku+i:n) from the r
ight */

		i__2 = *n - *ku - i + 1;
		clacgv_slu(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		cgemv_("No transpose", &i__2, &i__3, &c_b2, &a[i + 1 + (*ku + 
			i) * a_dim1], lda, &a[i + (*ku + i) * a_dim1], lda, &
			c_b1, &work[1], &c__1);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &work[1], &c__1, &a[i + (*ku + i) 
			* a_dim1], lda, &a[i + 1 + (*ku + i) * a_dim1], lda);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }

/* Computing MIN */
	    i__2 = *m - 1 - *kl;
	    if (i <= SUPERLU_MIN(i__2,*n)) {

/*              generate reflection to annihilate A(kl+i+1:m,i
) */

		i__2 = *m - *kl - i + 1;
		wn = scnrm2_(&i__2, &a[*kl + i + i * a_dim1], &c__1);
		d__1 = wn / c_abs(&a[*kl + i + i * a_dim1]);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = *kl + i + i * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *m - *kl - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[*kl + i + 1 + i * a_dim1], &c__1);
		    i__2 = *kl + i + i * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(kl+i:m,i+1:n) from the l
eft */

		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		cgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*kl + i 
			+ (i + 1) * a_dim1], lda, &a[*kl + i + i * a_dim1], &
			c__1, &c_b1, &work[1], &c__1);
		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &a[*kl + i + i * a_dim1], &c__1, &
			work[1], &c__1, &a[*kl + i + (i + 1) * a_dim1], lda);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }
	}

	i__2 = *m;
	for (j = *kl + i + 1; j <= i__2; ++j) {
	    i__3 = j + i * a_dim1;
	    a[i__3].r = 0.f, a[i__3].i = 0.f;
/* L50: */
	}

	i__2 = *n;
	for (j = *ku + i + 1; j <= i__2; ++j) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0.f, a[i__3].i = 0.f;
/* L60: */
	}
/* L70: */
    }
    return 0;

/*     End of CLAGGE */

}